

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClrDirWrapper.cpp
# Opt level: O1

addr_type __thiscall
ClrDirWrapper::containsAddrType(ClrDirWrapper *this,size_t fieldId,size_t subField)

{
  Executable *pEVar1;
  int iVar2;
  offset_t oVar3;
  undefined4 extraout_var;
  
  if (fieldId < 0x12) {
    if ((0x2aa88UL >> (fieldId & 0x3f) & 1) != 0) {
      return RVA;
    }
    if (fieldId == 6) {
      oVar3 = DataDirEntryWrapper::getDirEntryAddress(&this->super_DataDirEntryWrapper);
      pEVar1 = (this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
               super_ExeElementWrapper.m_Exe;
      iVar2 = (*(pEVar1->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0xe])
                        (pEVar1,oVar3,2,0x48,0);
      if (CONCAT44(extraout_var,iVar2) == 0) {
        return NOT_ADDR;
      }
      return *(uint *)(CONCAT44(extraout_var,iVar2) + 0x10) >> 3 & RVA;
    }
  }
  return NOT_ADDR;
}

Assistant:

Executable::addr_type ClrDirWrapper::containsAddrType(size_t fieldId, size_t subField)
{
    switch (fieldId) {
        case ENTRY_POINT: {
            const pe::IMAGE_COR20_HEADER* d = clrDir();
            if (!d) return Executable::NOT_ADDR;
            if (d->Flags & pe::COMIMAGE_FLAGS_NATIVE_ENTRYPOINT) {
                return Executable::RVA;
            } else {
                return Executable::NOT_ADDR;
            }
        }
        case RESOURCES_VA: 
        case META_DATA_VA:
        case STRONG_NAME_SIGNATURE_VA:
        case CODE_MANAGER_TABLE_VA: 
        case VTABLE_FIXUPS_VA: 
        case EXPORT_ADDR_TABLE_JMPS_VA: 
        case MANAGED_NATIVE_HDR_VA: 
            return Executable::RVA;
    }
    return Executable::NOT_ADDR;
}